

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
* __thiscall
nonius::execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>::
run<std::chrono::_V2::system_clock>
          (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
           *__return_storage_ptr__,
          execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *this,
          configuration cfg,
          environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env)

{
  int __n;
  long lVar1;
  int *in_RDX;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> **ppeVar2;
  undefined8 *puVar3;
  byte bVar4;
  anon_class_72_2_633b781a in_stack_ffffffffffffff48;
  repeater<nonius::now<std::chrono::_V2::system_clock>_> local_61;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *local_60;
  int local_58;
  undefined4 uStack_54;
  double dStack_50;
  int local_48;
  undefined4 uStack_44;
  pointer pcStack_40;
  size_type local_38;
  size_type sStack_30;
  undefined8 local_28;
  pointer pcStack_20;
  
  bVar4 = 0;
  detail::
  run_for_at_least<std::chrono::_V2::system_clock,nonius::detail::repeater<nonius::now<std::chrono::_V2::system_clock>>>
            (&this->params,(Duration<std::chrono::_V2::system_clock>)(long)(this->warmup_time).__r,
             this->warmup_iterations,&local_61);
  (__return_storage_ptr__->
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  ::reserve(__return_storage_ptr__,(long)*in_RDX);
  __n = *in_RDX;
  local_60 = this;
  local_58 = cfg.samples;
  uStack_54 = cfg._4_4_;
  dStack_50 = cfg.confidence_interval;
  local_48 = cfg.resamples;
  uStack_44 = cfg._20_4_;
  pcStack_40 = cfg.title._M_dataplus._M_p;
  local_38 = cfg.title._M_string_length;
  sStack_30 = cfg.title.field_2._M_allocated_capacity;
  local_28 = cfg.title.field_2._8_8_;
  pcStack_20 = cfg.output_file._M_dataplus._M_p;
  ppeVar2 = &local_60;
  puVar3 = (undefined8 *)&stack0xffffffffffffff48;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *ppeVar2;
    ppeVar2 = ppeVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  std::
  generate_n<std::back_insert_iterator<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,int,nonius::execution_plan<std::chrono::duration<double,std::ratio<1l,1000000000l>>>::run<std::chrono::_V2::system_clock>(nonius::configuration,nonius::environment<std::chrono::duration<double,std::chrono::_V2::system_clock::period>>)const::_lambda()_1_>
            ((back_insert_iterator<std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
              )__return_storage_ptr__,__n,in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<FloatDuration<Clock>> run(configuration cfg, environment<FloatDuration<Clock>> env) const {
            // warmup a bit
            detail::run_for_at_least<Clock>(params, chrono::duration_cast<nonius::Duration<Clock>>(warmup_time), warmup_iterations, detail::repeat(now<Clock>{}));

            std::vector<FloatDuration<Clock>> times;
            times.reserve(cfg.samples);
            std::generate_n(std::back_inserter(times), cfg.samples, [this, env]{
                    detail::chronometer_model<Clock> model;
                    detail::optimizer_barrier();
                    this->benchmark(chronometer(model, iterations_per_sample, params));
                    detail::optimizer_barrier();
                    auto sample_time = model.elapsed() - env.clock_cost.mean;
                    if(sample_time < FloatDuration<Clock>::zero()) sample_time = FloatDuration<Clock>::zero();
                    return sample_time / iterations_per_sample;
            });
            return times;
        }